

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_3::generateRandomInputData
               (Random *rnd,ShaderType shaderType,DataType dataType,Precision precision,
               deUint32 *dst,int numValues)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  iVar8 = (int)dst;
  uVar2 = glu::getDataTypeScalarSize(shaderType);
  bVar5 = (char)*(undefined4 *)(&DAT_018a3da0 + (ulong)dataType * 4) - 1;
  uVar11 = (2 << (bVar5 & 0x1f)) - 1;
  if (shaderType - 0x1f < 4) {
    iVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    for (iVar10 = 0; uVar9 = uVar7, iVar1 = iVar6, iVar10 != iVar8; iVar10 = iVar10 + 1) {
      while (uVar9 != 0) {
        dVar3 = deRandom_getUint32(&rnd->m_rnd);
        *(deUint32 *)(CONCAT44(in_register_0000000c,precision) + (long)iVar1 * 4) = dVar3 & uVar11;
        uVar9 = uVar9 - 1;
        iVar1 = iVar1 + 1;
      }
      iVar6 = iVar6 + uVar2;
    }
  }
  else {
    iVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    for (iVar10 = 0; uVar9 = uVar7, iVar1 = iVar6, iVar10 != iVar8; iVar10 = iVar10 + 1) {
      while (uVar9 != 0) {
        dVar3 = deRandom_getUint32(&rnd->m_rnd);
        uVar4 = dVar3 & uVar11;
        *(uint *)(CONCAT44(in_register_0000000c,precision) + (long)iVar1 * 4) =
             (uVar4 & 1 << (bVar5 & 0x1f)) * -2 | uVar4;
        uVar9 = uVar9 - 1;
        iVar1 = iVar1 + 1;
      }
      iVar6 = iVar6 + uVar2;
    }
  }
  return;
}

Assistant:

static void generateRandomInputData (de::Random& rnd, glu::ShaderType shaderType, glu::DataType dataType, glu::Precision precision, deUint32* dst, int numValues)
{
	const int				scalarSize		= glu::getDataTypeScalarSize(dataType);
	const deUint32			integerLength	= (deUint32)getShaderUintBitCount(shaderType, precision);
	const deUint32			integerMask		= getLowBitMask(integerLength);
	const bool				isUnsigned		= glu::isDataTypeUintOrUVec(dataType);

	if (isUnsigned)
	{
		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				dst[valueNdx*scalarSize + compNdx] = rnd.getUint32() & integerMask;
	}
	else
	{
		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				dst[valueNdx*scalarSize + compNdx] = extendSignTo32(rnd.getUint32() & integerMask, integerLength);
	}
}